

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O2

void Cba_ManBoxNumRec_rec(Cba_Ntk_t *p,int *pCountP,int *pCountU)

{
  int iVar1;
  Cba_ObjType_t CVar2;
  int iVar3;
  uint uVar4;
  int i;
  Cba_Ntk_t *p_00;
  
  iVar1 = p->Id;
  if (pCountP[iVar1] < 0) {
    pCountU[iVar1] = 0;
    pCountP[iVar1] = 0;
    for (i = 1; i < (p->vObjType).nSize; i = i + 1) {
      CVar2 = Cba_ObjType(p,i);
      if (CVar2 != CBA_OBJ_NONE) {
        iVar3 = Cba_ObjIsBoxUser(p,i);
        if (iVar3 == 0) {
          pCountP[iVar1] = pCountP[iVar1] + 1;
        }
        else {
          uVar4 = Cba_ObjNtkId(p,i);
          if (((int)uVar4 < 1) || ((p->pDesign->vNtks).nSize <= (int)uVar4)) {
            p_00 = (Cba_Ntk_t *)0x0;
          }
          else {
            p_00 = (Cba_Ntk_t *)(p->pDesign->vNtks).pArray[uVar4];
          }
          Cba_ManBoxNumRec_rec(p_00,pCountP,pCountU);
          iVar3 = Cba_ObjNtkId(p,i);
          pCountP[iVar1] = pCountP[iVar1] + pCountP[iVar3];
          iVar3 = Cba_ObjNtkId(p,i);
          pCountU[iVar1] = pCountU[iVar3] + pCountU[iVar1] + 1;
        }
      }
    }
  }
  return;
}

Assistant:

static inline void Cba_ManBoxNumRec_rec( Cba_Ntk_t * p, int * pCountP, int * pCountU )
{
    int iObj, Id = Cba_NtkId(p);
    if ( pCountP[Id] >= 0 )
        return;
    pCountP[Id] = pCountU[Id] = 0;
    Cba_NtkForEachObj( p, iObj )
    {
        if ( Cba_ObjIsBoxUser(p, iObj) )
        {
            Cba_ManBoxNumRec_rec( Cba_ObjNtk(p, iObj), pCountP, pCountU );
            pCountP[Id] += pCountP[Cba_ObjNtkId(p, iObj)];
            pCountU[Id] += pCountU[Cba_ObjNtkId(p, iObj)] + 1;
        }
        else
            pCountP[Id] += 1;
    }
}